

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::setNum(QString *this,qlonglong n,int base)

{
  long lVar1;
  QString *pQVar2;
  undefined4 in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  number(CONCAT44(in_EDX,in_stack_ffffffffffffffc8),(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20))
  ;
  pQVar2 = operator=(in_RDI,in_stack_ffffffffffffffa8);
  ~QString((QString *)0x518254);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::setNum(qlonglong n, int base)
{
    return *this = number(n, base);
}